

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::RemoveLogSink(LogSink *destination)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  MutexLock l;
  MutexLock local_10;
  
  local_10.mu_ = (Mutex *)LogDestination::sink_mutex_;
  if (LogDestination::sink_mutex_[0x38] == '\x01') {
    iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)LogDestination::sink_mutex_);
    if (iVar2 != 0) {
      abort();
    }
  }
  if (LogDestination::sinks_ != (long *)0x0) {
    lVar1 = *LogDestination::sinks_;
    uVar3 = (ulong)(LogDestination::sinks_[1] - lVar1) >> 3;
    do {
      uVar3 = uVar3 - 1;
      if ((int)(uint)uVar3 < 0) goto LAB_0011210c;
      uVar4 = (ulong)((uint)uVar3 & 0x7fffffff);
    } while (*(LogSink **)(lVar1 + uVar4 * 8) != destination);
    *(undefined8 *)(lVar1 + uVar4 * 8) =
         *(undefined8 *)(lVar1 + -8 + (LogDestination::sinks_[1] - lVar1));
    LogDestination::sinks_[1] = LogDestination::sinks_[1] + -8;
  }
LAB_0011210c:
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_10);
  return;
}

Assistant:

void RemoveLogSink(LogSink *destination) {
  LogDestination::RemoveLogSink(destination);
}